

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

CavsByColor *
Omega_h::separate_by_color
          (CavsByColor *__return_storage_ptr__,Cavs *cavs,LOs *old_elem_colors,LOs *new_elem_colors)

{
  int *piVar1;
  Alloc *pAVar2;
  LO LVar3;
  SeparationResult res;
  LOs local_108;
  LOs local_f8;
  Cavs local_e8;
  SeparationResult local_a8;
  
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    LVar3 = Graph::nedges(&cavs->keys2old_elems);
    if (LVar3 == 0) {
      LVar3 = Graph::nedges(&cavs->keys2new_elems);
      if (LVar3 == 0) {
        return __return_storage_ptr__;
      }
    }
    local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_e8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_e8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
    local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_e8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
    local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_e8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         (cavs->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
    local_f8.write_.shared_alloc_.alloc = (old_elem_colors->write_).shared_alloc_.alloc;
    if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f8.write_.shared_alloc_.alloc =
             (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f8.write_.shared_alloc_.alloc)->use_count =
             (local_f8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f8.write_.shared_alloc_.direct_ptr = (old_elem_colors->write_).shared_alloc_.direct_ptr;
    local_108.write_.shared_alloc_.alloc = (new_elem_colors->write_).shared_alloc_.alloc;
    if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
        local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_108.write_.shared_alloc_.alloc =
             (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_108.write_.shared_alloc_.alloc)->use_count =
             (local_108.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_108.write_.shared_alloc_.direct_ptr = (new_elem_colors->write_).shared_alloc_.direct_ptr;
    separate_by_color_once(&local_a8,&local_e8,&local_f8,&local_108);
    pAVar2 = local_108.write_.shared_alloc_.alloc;
    if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
        local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_f8.write_.shared_alloc_.alloc;
    if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    Cavs::~Cavs(&local_e8);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__,&local_a8.separated);
    Graph::operator=(&cavs->keys2old_elems,&local_a8.remainder.keys2old_elems);
    Graph::operator=(&cavs->keys2new_elems,&local_a8.remainder.keys2new_elems);
    Cavs::~Cavs(&local_a8.remainder);
    Cavs::~Cavs(&local_a8.separated);
  } while( true );
}

Assistant:

static CavsByColor separate_by_color(
    Cavs cavs, LOs old_elem_colors, LOs new_elem_colors) {
  CavsByColor cavs_by_color;
  while (cavs.keys2old_elems.nedges() || cavs.keys2new_elems.nedges()) {
    auto res = separate_by_color_once(cavs, old_elem_colors, new_elem_colors);
    cavs_by_color.push_back(res.separated);
    cavs = res.remainder;
  }
  return cavs_by_color;
}